

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_time.c
# Opt level: O2

timeval * zt_diff_time(timeval *dt,timeval *t1,timeval *t2)

{
  long lVar1;
  long lVar2;
  
  lVar1 = t2->tv_sec - t1->tv_sec;
  lVar2 = t2->tv_usec - t1->tv_usec;
  dt->tv_sec = lVar1;
  dt->tv_usec = lVar2;
  while (lVar1 = lVar1 + -1, lVar2 < 0) {
    lVar2 = lVar2 + 1000000;
    dt->tv_usec = lVar2;
    dt->tv_sec = lVar1;
  }
  return dt;
}

Assistant:

struct timeval *
zt_diff_time(struct timeval *dt, struct timeval *t1, struct timeval *t2)
{
    dt->tv_sec = t2->tv_sec - t1->tv_sec;
    dt->tv_usec = t2->tv_usec - t1->tv_usec;

    while (dt->tv_usec < 0) {
        dt->tv_usec += 1000000;
        dt->tv_sec -= 1;
    }
    return dt;
}